

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAddEaRg<(moira::Instr)4,(moira::Mode)9,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  bool error;
  bool local_19;
  
  uVar1 = computeEA<(moira::Mode)9,(moira::Size)2,0ul>(this,opcode & 7);
  uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,128ul>(this,uVar1,&local_19);
  if (local_19 == false) {
    uVar4 = (ulong)(opcode >> 9 & 7);
    uVar2 = (uint)*(ushort *)((long)this->exec + uVar4 * 4 + -0x58);
    uVar5 = uVar1 + uVar2;
    bVar3 = (bool)((byte)(uVar5 >> 0x10) & 1);
    (this->reg).sr.c = bVar3;
    (this->reg).sr.x = bVar3;
    (this->reg).sr.v = (bool)((byte)(((uVar2 ^ uVar5) & (uVar1 ^ uVar5)) >> 0xf) & 1);
    (this->reg).sr.z = (short)uVar5 == 0;
    (this->reg).sr.n = (bool)((byte)(uVar5 >> 0xf) & 1);
    uVar1 = (this->reg).pc;
    (this->reg).pc0 = uVar1;
    (this->queue).ird = (this->queue).irc;
    uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
    (this->queue).irc = (u16)uVar1;
    *(short *)((long)this->exec + uVar4 * 4 + -0x58) = (short)uVar5;
  }
  return;
}

Assistant:

void
Moira::execAddEaRg(u16 opcode)
{
    u32 ea, data, result;
    
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);
    
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    
    result = addsub<I,S>(data, readD<S>(dst));
    prefetch<POLLIPL>();
    
    if (S == Long) sync(2 + (isMemMode(M) ? 0 : 2));
    writeD<S>(dst, result);
}